

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O1

void Curl_conn_ev_data_done(Curl_easy *data,_Bool premature)

{
  connectdata *pcVar1;
  Curl_cft_cntrl *pCVar2;
  undefined7 in_register_00000031;
  long lVar3;
  Curl_cfilter *pCVar4;
  bool bVar5;
  
  pcVar1 = data->conn;
  lVar3 = 0;
  do {
    for (pCVar4 = pcVar1->cfilter[lVar3]; pCVar4 != (Curl_cfilter *)0x0; pCVar4 = pCVar4->next) {
      pCVar2 = pCVar4->cft->cntrl;
      if (pCVar2 != Curl_cf_def_cntrl) {
        (*pCVar2)(pCVar4,data,7,(int)CONCAT71(in_register_00000031,premature),(void *)0x0);
      }
    }
    bVar5 = lVar3 == 0;
    lVar3 = lVar3 + 1;
  } while (bVar5);
  return;
}

Assistant:

void Curl_conn_ev_data_done(struct Curl_easy *data, bool premature)
{
  cf_cntrl_all(data->conn, data, TRUE, CF_CTRL_DATA_DONE, premature, NULL);
}